

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFrame.h
# Opt level: O0

void __thiscall
chrono::ChFrame<double>::SetCoord
          (ChFrame<double> *this,ChVector<double> *mv,ChQuaternion<double> *mq)

{
  ChQuaternion<double> *mq_local;
  ChVector<double> *mv_local;
  ChFrame<double> *this_local;
  
  ChVector<double>::operator=(&(this->coord).pos,mv);
  ChQuaternion<double>::operator=(&(this->coord).rot,mq);
  ChMatrix33<double>::Set_A_quaternion(&this->Amatrix,mq);
  return;
}

Assistant:

void SetCoord(const ChVector<Real>& mv, const ChQuaternion<Real>& mq) {
        coord.pos = mv;
        coord.rot = mq;
        Amatrix.Set_A_quaternion(mq);
    }